

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl3cCommonBugsTests.cpp
# Opt level: O0

string * __thiscall
gl3cts::ReservedNamesTest::getShaderTypeName_abi_cxx11_
          (string *__return_storage_ptr__,ReservedNamesTest *this,_shader_type shader_type)

{
  allocator<char> local_1e;
  undefined1 local_1d;
  _shader_type local_1c;
  ReservedNamesTest *pRStack_18;
  _shader_type shader_type_local;
  ReservedNamesTest *this_local;
  string *result;
  
  local_1d = 0;
  local_1c = shader_type;
  pRStack_18 = this;
  this_local = (ReservedNamesTest *)__return_storage_ptr__;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)__return_storage_ptr__,"[?!]",&local_1e);
  std::allocator<char>::~allocator(&local_1e);
  switch(local_1c) {
  case LANGUAGE_FEATURE_ATOMIC_COUNTER:
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,"compute shader");
    break;
  case LANGUAGE_FEATURE_ATTRIBUTE:
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,"fragment shader");
    break;
  case LANGUAGE_FEATURE_CONSTANT:
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,"geometry shader");
    break;
  case LANGUAGE_FEATURE_FUNCTION_ARGUMENT_NAME:
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,"tessellation control shader");
    break;
  case LANGUAGE_FEATURE_FUNCTION_NAME:
    std::__cxx11::string::operator=
              ((string *)__return_storage_ptr__,"tessellation evaluation shader");
    break;
  case LANGUAGE_FEATURE_INPUT:
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,"vertex shader");
    break;
  default:
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,"unknown");
  }
  return __return_storage_ptr__;
}

Assistant:

std::string ReservedNamesTest::getShaderTypeName(_shader_type shader_type) const
{
	std::string result = "[?!]";

	switch (shader_type)
	{
	case SHADER_TYPE_COMPUTE:
		result = "compute shader";
		break;
	case SHADER_TYPE_FRAGMENT:
		result = "fragment shader";
		break;
	case SHADER_TYPE_GEOMETRY:
		result = "geometry shader";
		break;
	case SHADER_TYPE_TESS_CONTROL:
		result = "tessellation control shader";
		break;
	case SHADER_TYPE_TESS_EVALUATION:
		result = "tessellation evaluation shader";
		break;
	case SHADER_TYPE_VERTEX:
		result = "vertex shader";
		break;
	default:
		result = "unknown";
		break;
	} /* switch (shader_type) */

	return result;
}